

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzNegMod_fast(word *b,word *a,word *mod,size_t n)

{
  bool_t bVar1;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  
  bVar1 = wwIsZero(in_RSI,in_RCX);
  if (bVar1 == 0) {
    zzSub(in_RDI,in_RDX,in_RSI,in_RCX);
  }
  else {
    wwSetZero(in_RDI,in_RCX);
  }
  return;
}

Assistant:

void FAST(zzNegMod)(word b[], const word a[], const word mod[], size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	// a != 0 => b <- mod - a
	if (!wwIsZero(a, n))
		zzSub(b, mod, a, n);
	else
		wwSetZero(b, n);
}